

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBGInterface.cpp
# Opt level: O1

int handlesbginterface(RS232PORT *pSBGInterfacePseudoRS232Port)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  uint16 j_1;
  uint uVar7;
  int iVar8;
  ssize_t sVar9;
  char cVar10;
  uint uVar11;
  int iVar12;
  uint16 j;
  long lVar13;
  ulong uVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dc_01;
  uint extraout_XMM0_Dc_02;
  uint extraout_XMM0_Dc_03;
  uint extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  uint extraout_XMM0_Dd_01;
  uint extraout_XMM0_Dd_02;
  uint extraout_XMM0_Dd_03;
  uint extraout_XMM0_Dd_04;
  undefined4 uVar15;
  float fVar16;
  float fVar17;
  int sendbuflen;
  uint8 sendbuf [8192];
  int local_21ec;
  double local_21e8;
  float local_21e0;
  float local_21dc;
  undefined8 local_21d8;
  uint uStack_21d0;
  uint uStack_21cc;
  undefined1 local_21c8 [16];
  float local_21b4;
  float local_21b0;
  float local_21ac;
  undefined8 local_21a8;
  uint uStack_21a0;
  uint uStack_219c;
  undefined8 local_2198;
  uint uStack_2190;
  uint uStack_218c;
  undefined1 local_2188 [16];
  undefined1 local_2178 [16];
  float local_2168;
  uint uStack_2164;
  uint uStack_2160;
  uint uStack_215c;
  double local_2158;
  double local_2150;
  undefined1 local_2148 [16];
  uchar local_2138;
  undefined1 uStack_2137;
  undefined1 uStack_2136;
  undefined1 uStack_2135;
  undefined2 uStack_2134;
  undefined2 uStack_2132;
  undefined2 uStack_2130;
  undefined2 uStack_212e;
  undefined2 uStack_212c;
  undefined1 uStack_212a;
  undefined1 uStack_2129;
  undefined2 uStack_2128;
  undefined1 uStack_2126;
  undefined1 uStack_2125;
  undefined2 uStack_2124;
  undefined2 uStack_2122;
  undefined2 uStack_2120;
  undefined2 uStack_211e;
  undefined2 uStack_211c;
  undefined2 uStack_211a;
  undefined4 uStack_2118;
  undefined2 local_2114;
  undefined4 local_2112;
  undefined2 local_210e;
  undefined2 uStack_210c;
  undefined2 uStack_210a;
  undefined2 uStack_2108;
  undefined8 uStack_2106;
  timespec local_2038;
  uchar local_2028 [2];
  byte abStack_2026 [4];
  undefined8 local_2022;
  undefined8 uStack_201a;
  undefined8 local_2012;
  undefined4 local_2002;
  undefined2 local_1ffe;
  undefined4 local_1ffc;
  undefined8 local_1ff8;
  undefined8 uStack_1ff0;
  undefined1 local_1fe8;
  undefined1 local_1fe7;
  undefined1 local_1fe6;
  
  local_21c8._8_8_ = local_21c8._0_8_;
  local_21ec = 0;
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  dVar1 = Center((interval *)&phihat);
  dVar1 = fmod(dVar1,6.283185307179586);
  dVar1 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
  local_21dc = (float)(dVar1 + -3.141592653589793);
  dVar1 = Center((interval *)&thetahat);
  dVar1 = fmod(-dVar1,6.283185307179586);
  dVar1 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
  local_21e0 = (float)(dVar1 + -3.141592653589793);
  local_21d8 = -(double)CONCAT44(angle_env._4_4_,angle_env._0_4_);
  uStack_21d0 = 0;
  uStack_21cc = 0x80000000;
  dVar1 = Center((interval *)&psihat);
  dVar1 = fmod((local_21d8 - dVar1) + 1.5707963267948966,6.283185307179586);
  dVar1 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
  local_21ac = (float)(dVar1 + -3.141592653589793);
  local_21e8 = (double)local_21dc;
  local_21d8 = (double)local_21e0;
  local_21c8._0_8_ = (double)local_21ac * 0.5;
  dVar1 = cos((double)local_21ac * 0.5);
  local_2188._8_4_ = extraout_XMM0_Dc;
  local_2188._0_8_ = dVar1;
  local_2188._12_4_ = extraout_XMM0_Dd;
  dVar1 = sin((double)local_21c8._0_8_);
  local_21c8._8_4_ = extraout_XMM0_Dc_00;
  local_21c8._0_8_ = dVar1;
  local_21c8._12_4_ = extraout_XMM0_Dd_00;
  local_21e8 = local_21e8 * 0.5;
  local_2198 = cos(local_21e8);
  local_21a8 = sin(local_21e8);
  local_21d8 = local_21d8 * 0.5;
  local_21e8 = cos(local_21d8);
  dVar1 = sin(local_21d8);
  auVar6 = local_2188;
  dVar2 = (double)local_2188._0_8_ * local_2198;
  dVar3 = local_21c8._0_8_ * local_21a8;
  local_2188._0_8_ = (double)local_2188._0_8_ * local_21a8;
  uVar15 = local_21c8._8_4_;
  uVar7 = local_21c8._12_4_;
  dVar4 = local_21c8._0_8_ * local_2198;
  local_21c8._8_4_ = uVar15;
  local_21c8._0_8_ = dVar4;
  local_21c8._12_4_ = uVar7;
  local_2148._8_4_ = uVar15;
  local_2148._0_8_ = -dVar4 * dVar1;
  local_2148._12_4_ = uVar7 ^ 0x80000000;
  local_2178._8_4_ = auVar6._8_4_;
  local_2178._0_8_ = -(double)local_2188._0_8_ * dVar1;
  local_2178._12_4_ = auVar6._12_4_ ^ 0x80000000;
  local_21b4 = (float)(dVar2 * local_21e8 + dVar3 * dVar1);
  local_21b0 = (float)(dVar2 * dVar1 + dVar3 * local_21e8);
  local_2150 = Center((interval *)&accrxhat);
  dVar1 = Center((interval *)&accryhat);
  local_21d8 = (double)CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1);
  uStack_21d0 = extraout_XMM0_Dc_01;
  uStack_21cc = extraout_XMM0_Dd_01;
  dVar1 = Center((interval *)&accrzhat);
  local_2198 = (double)CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1);
  uStack_2190 = extraout_XMM0_Dc_02;
  uStack_218c = extraout_XMM0_Dd_02;
  local_2158 = Center((interval *)&omegaxhat);
  dVar1 = Center((interval *)&omegayhat);
  local_21a8 = (double)CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1);
  uStack_21a0 = extraout_XMM0_Dc_03;
  uStack_219c = extraout_XMM0_Dd_03;
  dVar1 = Center((interval *)&omegazhat);
  uStack_2164 = (uint)((ulong)dVar1 >> 0x20);
  local_2168 = (float)dVar1;
  uStack_2160 = extraout_XMM0_Dc_04;
  uStack_215c = extraout_XMM0_Dd_04;
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  lVar13 = 0;
  memset(&uStack_2125,0,0xed);
  local_2138 = 'E';
  uStack_2137 = 0x4c;
  uStack_2136 = 0x4c;
  uStack_2135 = 0x49;
  uStack_2134 = 0x5350;
  uStack_2132 = 0x3245;
  uStack_2130 = 0x412d;
  uStack_212e = 0x472d;
  uStack_212c = 0x4134;
  uStack_212a = 0x33;
  uStack_2129 = 0x2d;
  uStack_2128 = 0x3142;
  uStack_2126 = 0;
  uStack_2118 = 45000000;
  local_2112 = 0x7e30101;
  local_210e = 0x1604;
  uStack_210a = 0x101;
  uStack_2106 = CONCAT62(uStack_2106._2_6_,0x106);
  _local_2028 = 0x10045aff;
  abStack_2026[2] = 0x3a;
  abStack_2026[3] = 0;
  local_2012 = CONCAT26(uStack_2122,CONCAT24(uStack_2124,CONCAT13(uStack_2125,0x3142)));
  local_2002 = 45000000;
  local_1ffe = local_2114;
  local_1ffc = 0x7e30101;
  local_1ff8 = CONCAT26(uStack_2108,CONCAT24(0x101,CONCAT22(uStack_210c,0x1604)));
  uStack_1ff0 = uStack_2106;
  local_2022 = 0x32455350494c4c45;
  uStack_201a = 0x2d334134472d412d;
  uVar7 = 0;
  do {
    uVar7 = uVar7 ^ local_2028[lVar13 + 2];
    cVar10 = '\b';
    do {
      uVar11 = (uVar7 & 0xffff) >> 1;
      uVar5 = uVar7 & 1;
      uVar7 = uVar11 ^ 0xffff8408;
      if (uVar5 == 0) {
        uVar7 = uVar11;
      }
      cVar10 = cVar10 + -1;
    } while (cVar10 != '\0');
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x3e);
  local_1fe8 = (undefined1)uVar7;
  local_1fe7 = (undefined1)(uVar7 >> 8);
  local_1fe6 = 0x33;
  local_21ec = 0x43;
  iVar12 = 1;
  if (pSBGInterfacePseudoRS232Port->DevType - 1U < 4) {
    iVar8 = pSBGInterfacePseudoRS232Port->s;
    uVar14 = 0;
    do {
      sVar9 = send(iVar8,local_2028 + uVar14,(long)(0x43 - (int)uVar14),0);
      if ((int)sVar9 < 1) {
        return 1;
      }
      uVar7 = (int)uVar14 + (int)sVar9;
      uVar14 = (ulong)uVar7;
    } while ((int)uVar7 < 0x43);
  }
  else {
    if (pSBGInterfacePseudoRS232Port->DevType != 0) {
      return 1;
    }
    iVar8 = *(int *)&pSBGInterfacePseudoRS232Port->hDev;
    uVar14 = 0;
    do {
      sVar9 = write(iVar8,local_2028 + uVar14,(ulong)(0x43 - (int)uVar14));
      if ((int)sVar9 < 1) {
        return 1;
      }
      uVar7 = (int)uVar14 + (int)sVar9;
      uVar14 = (ulong)uVar7;
    } while (uVar7 < 0x43);
  }
  fVar17 = (float)((double)local_2188._0_8_ * local_21e8 + (double)local_2148._0_8_);
  fVar16 = (float)((double)local_21c8._0_8_ * local_21e8 + (double)local_2178._0_8_);
  uStack_21d0 = uStack_21d0 ^ 0x80000000;
  uStack_21cc = uStack_21cc ^ 0x80000000;
  uStack_2190 = uStack_2190 ^ 0x80000000;
  uStack_218c = uStack_218c ^ 0x80000000;
  uStack_21a0 = uStack_21a0 ^ 0x80000000;
  uStack_219c = uStack_219c ^ 0x80000000;
  local_2168 = -local_2168;
  uStack_2164 = uStack_2164 ^ 0x80000000;
  uStack_2160 = uStack_2160 ^ 0x80000000;
  uStack_215c = uStack_215c ^ 0x80000000;
  local_2138 = '\x03';
  uStack_2136 = 0x10;
  lVar13 = 0;
  uStack_2134 = 0;
  _local_2028 = 0x10005aff;
  abStack_2026[2] = 6;
  abStack_2026[3] = 0;
  local_2022._0_6_ = (uint6)CONCAT13(uStack_2135,CONCAT12(0x10,CONCAT11(uStack_2137,3)));
  uVar7 = 0;
  do {
    uVar7 = uVar7 ^ local_2028[lVar13 + 2];
    cVar10 = '\b';
    do {
      uVar11 = (uVar7 & 0xffff) >> 1;
      uVar5 = uVar7 & 1;
      uVar7 = uVar11 ^ 0xffff8408;
      if (uVar5 == 0) {
        uVar7 = uVar11;
      }
      cVar10 = cVar10 + -1;
    } while (cVar10 != '\0');
    lVar13 = lVar13 + 1;
  } while (lVar13 != 10);
  local_2022._0_7_ = CONCAT16((char)uVar7,(uint6)local_2022);
  local_2022 = CONCAT17((char)(uVar7 >> 8),(undefined7)local_2022);
  uStack_201a = CONCAT71(uStack_201a._1_7_,0x33);
  local_21ec = 0xf;
  if (pSBGInterfacePseudoRS232Port->DevType - 1U < 4) {
    local_2188._0_4_ = fVar17;
    local_21e8 = (double)CONCAT44(local_21e8._4_4_,fVar16);
    local_2178._0_4_ = (float)local_2158;
    local_21c8._0_4_ = (float)local_2150;
    local_21a8 = (double)((ulong)local_21a8 ^ 0x8000000080000000);
    local_2198 = (double)((ulong)local_2198 ^ 0x8000000080000000);
    local_21d8 = (double)((ulong)local_21d8 ^ 0x8000000080000000);
    iVar8 = pSBGInterfacePseudoRS232Port->s;
    uVar14 = 0;
    do {
      sVar9 = send(iVar8,local_2028 + uVar14,(long)(0xf - (int)uVar14),0);
      if ((int)sVar9 < 1) {
        return 1;
      }
      uVar7 = (int)uVar14 + (int)sVar9;
      uVar14 = (ulong)uVar7;
    } while ((int)uVar7 < 0xf);
  }
  else {
    if (pSBGInterfacePseudoRS232Port->DevType != 0) {
      return 1;
    }
    local_2188._0_4_ = fVar17;
    local_21e8 = (double)CONCAT44(local_21e8._4_4_,fVar16);
    local_2178._0_4_ = (float)local_2158;
    local_21c8._0_4_ = (float)local_2150;
    local_21a8 = (double)((ulong)local_21a8 ^ 0x8000000080000000);
    local_2198 = (double)((ulong)local_2198 ^ 0x8000000080000000);
    local_21d8 = (double)((ulong)local_21d8 ^ 0x8000000080000000);
    iVar8 = *(int *)&pSBGInterfacePseudoRS232Port->hDev;
    uVar14 = 0;
    do {
      sVar9 = write(iVar8,local_2028 + uVar14,(ulong)(0xf - (int)uVar14));
      if ((int)sVar9 < 1) {
        return 1;
      }
      uVar7 = (int)uVar14 + (int)sVar9;
      uVar14 = (ulong)uVar7;
    } while (uVar7 < 0xf);
  }
  local_2138 = '\0';
  uStack_2137 = 0;
  uStack_2136 = 0;
  uStack_2135 = 0;
  uStack_2134 = 0;
  _local_2028 = 0x10035aff;
  abStack_2026[2] = 6;
  abStack_2026[3] = 0;
  local_2022 = local_2022 & 0xffff000000000000;
  lVar13 = 0;
  uVar7 = 0;
  do {
    uVar7 = uVar7 ^ local_2028[lVar13 + 2];
    cVar10 = '\b';
    do {
      uVar11 = (uVar7 & 0xffff) >> 1;
      uVar5 = uVar7 & 1;
      uVar7 = uVar11 ^ 0xffff8408;
      if (uVar5 == 0) {
        uVar7 = uVar11;
      }
      cVar10 = cVar10 + -1;
    } while (cVar10 != '\0');
    lVar13 = lVar13 + 1;
  } while (lVar13 != 10);
  local_2022 = (ulong)(ushort)uVar7 << 0x30;
  uStack_201a = CONCAT71(uStack_201a._1_7_,0x33);
  local_21ec = 0xf;
  if (pSBGInterfacePseudoRS232Port->DevType - 1U < 4) {
    iVar8 = pSBGInterfacePseudoRS232Port->s;
    uVar14 = 0;
    do {
      sVar9 = send(iVar8,local_2028 + uVar14,(long)(0xf - (int)uVar14),0);
      if ((int)sVar9 < 1) {
        return 1;
      }
      uVar7 = (int)uVar14 + (int)sVar9;
      uVar14 = (ulong)uVar7;
    } while ((int)uVar7 < 0xf);
  }
  else {
    if (pSBGInterfacePseudoRS232Port->DevType != 0) {
      return 1;
    }
    iVar8 = *(int *)&pSBGInterfacePseudoRS232Port->hDev;
    uVar14 = 0;
    do {
      sVar9 = write(iVar8,local_2028 + uVar14,(ulong)(0xf - (int)uVar14));
      if ((int)sVar9 < 1) {
        return 1;
      }
      uVar7 = (int)uVar14 + (int)sVar9;
      uVar14 = (ulong)uVar7;
    } while (uVar7 < 0xf);
  }
  local_2138 = '\x03';
  uStack_2136 = 0x10;
  lVar13 = 0;
  uStack_2134 = 0;
  _local_2028 = 0x10005aff;
  abStack_2026[2] = 6;
  abStack_2026[3] = 0;
  local_2022._0_6_ = (uint6)CONCAT13(uStack_2135,CONCAT12(0x10,CONCAT11(uStack_2137,3)));
  uVar7 = 0;
  do {
    uVar7 = uVar7 ^ local_2028[lVar13 + 2];
    cVar10 = '\b';
    do {
      uVar11 = (uVar7 & 0xffff) >> 1;
      uVar5 = uVar7 & 1;
      uVar7 = uVar11 ^ 0xffff8408;
      if (uVar5 == 0) {
        uVar7 = uVar11;
      }
      cVar10 = cVar10 + -1;
    } while (cVar10 != '\0');
    lVar13 = lVar13 + 1;
  } while (lVar13 != 10);
  local_2022._0_7_ = CONCAT16((char)uVar7,(uint6)local_2022);
  local_2022 = CONCAT17((char)(uVar7 >> 8),(undefined7)local_2022);
  uStack_201a = CONCAT71(uStack_201a._1_7_,0x33);
  local_21ec = 0xf;
  if (pSBGInterfacePseudoRS232Port->DevType - 1U < 4) {
    iVar8 = pSBGInterfacePseudoRS232Port->s;
    uVar14 = 0;
    do {
      sVar9 = send(iVar8,local_2028 + uVar14,(long)(0xf - (int)uVar14),0);
      if ((int)sVar9 < 1) {
        return 1;
      }
      uVar7 = (int)uVar14 + (int)sVar9;
      uVar14 = (ulong)uVar7;
    } while ((int)uVar7 < 0xf);
  }
  else {
    if (pSBGInterfacePseudoRS232Port->DevType != 0) {
      return 1;
    }
    iVar8 = *(int *)&pSBGInterfacePseudoRS232Port->hDev;
    uVar14 = 0;
    do {
      sVar9 = write(iVar8,local_2028 + uVar14,(ulong)(0xf - (int)uVar14));
      if ((int)sVar9 < 1) {
        return 1;
      }
      uVar7 = (int)uVar14 + (int)sVar9;
      uVar14 = (ulong)uVar7;
    } while (uVar7 < 0xf);
  }
  local_2138 = '\x01';
  uStack_2137 = 0;
  uStack_2136 = 0;
  uStack_2135 = 0;
  uStack_2134 = 0;
  EncodeFrameSBG(local_2028,&local_21ec,'\x03','\x10',&local_2138,6);
  iVar8 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,local_2028,local_21ec);
  if (iVar8 == 0) {
    local_2138 = '\x03';
    uStack_2136 = 0x10;
    uStack_2134 = 0;
    EncodeFrameSBG(local_2028,&local_21ec,'\0','\x10',&local_2138,6);
    iVar8 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,local_2028,local_21ec);
    if (iVar8 == 0) {
      local_2138 = '\x02';
      uStack_2137 = 0;
      EncodeFrameSBG(local_2028,&local_21ec,'\x03','\x10',&local_2138,2);
      iVar8 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,local_2028,local_21ec);
      if (iVar8 == 0) {
        local_2138 = '\x03';
        uStack_2136 = 0x10;
        uStack_2134 = 0;
        EncodeFrameSBG(local_2028,&local_21ec,'\0','\x10',&local_2138,6);
        iVar8 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,local_2028,local_21ec);
        if (iVar8 == 0) {
          local_2138 = '\0';
          uStack_2137 = 0;
          uStack_2136 = 0;
          uStack_2135 = 0;
          uStack_2134 = SUB42(local_21dc,0);
          uStack_2132 = (undefined2)((uint)local_21dc >> 0x10);
          uStack_2130 = SUB42(local_21e0,0);
          uStack_212e = (undefined2)((uint)local_21e0 >> 0x10);
          uStack_212c = SUB42(local_21ac,0);
          uStack_212a = (undefined1)((uint)local_21ac >> 0x10);
          uStack_2129 = (undefined1)((uint)local_21ac >> 0x18);
          uStack_2128 = 0;
          uStack_2126 = 0;
          uStack_2125 = 0;
          uStack_2124 = 0;
          uStack_2122 = 0;
          uStack_2120 = 0;
          uStack_211e = 0;
          uStack_211c = 2;
          uStack_211a = 0;
          EncodeFrameSBG(local_2028,&local_21ec,'\x06','\0',&local_2138,0x20);
          iVar8 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,local_2028,local_21ec);
          if (iVar8 == 0) {
            local_2138 = '\0';
            uStack_2137 = 0;
            uStack_2136 = 0;
            uStack_2135 = 0;
            uStack_2134 = SUB42(local_21b4,0);
            uStack_2132 = (undefined2)((uint)local_21b4 >> 0x10);
            uStack_2130 = local_2188._0_2_;
            uStack_212e = local_2188._2_2_;
            uStack_212c = SUB42(local_21b0,0);
            uStack_212a = (undefined1)((uint)local_21b0 >> 0x10);
            uStack_2129 = (undefined1)((uint)local_21b0 >> 0x18);
            uStack_2128 = SUB82(local_21e8,0);
            uStack_2126 = (undefined1)((ulong)local_21e8 >> 0x10);
            uStack_2125 = (undefined1)((ulong)local_21e8 >> 0x18);
            uStack_2124 = 0;
            uStack_2122 = 0;
            uStack_2120 = 0;
            uStack_211e = 0;
            uStack_211c = 0;
            uStack_211a = 0;
            uStack_2118 = 2;
            EncodeFrameSBG(local_2028,&local_21ec,'\a','\0',&local_2138,0x24);
            iVar8 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,local_2028,local_21ec);
            if (iVar8 == 0) {
              local_2138 = '\0';
              uStack_2137 = 0;
              uStack_2136 = 0;
              uStack_2135 = 0;
              uStack_2134 = 0xffff;
              uStack_2132 = local_21c8._0_2_;
              uStack_2130 = local_21c8._2_2_;
              uStack_212e = SUB82(local_21d8,0);
              uStack_212c = (undefined2)((ulong)local_21d8 >> 0x10);
              uStack_212a = SUB81(local_2198,0);
              uStack_2129 = (undefined1)((ulong)local_2198 >> 8);
              uStack_2128 = (undefined2)((ulong)local_2198 >> 0x10);
              uStack_2126 = local_2178[0];
              uStack_2125 = local_2178[1];
              uStack_2124 = local_2178._2_2_;
              uStack_2122 = SUB82(local_21a8,0);
              uStack_2120 = (undefined2)((ulong)local_21a8 >> 0x10);
              uStack_211e = SUB42(local_2168,0);
              uStack_211c = (undefined2)((uint)local_2168 >> 0x10);
              uStack_211a = 0;
              uStack_2118 = 0;
              local_2114 = 0;
              local_2112 = 0;
              local_210e = 0;
              uStack_210c = 0;
              uStack_210a = 0;
              uStack_2108 = 0;
              uStack_2106 = 0;
              EncodeFrameSBG(local_2028,&local_21ec,'\x03','\0',&local_2138,0x3a);
              iVar8 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,local_2028,local_21ec);
              if (iVar8 == 0) {
                local_2038.tv_sec = 0;
                local_2038.tv_nsec = 20000000;
                nanosleep(&local_2038,(timespec *)0x0);
                iVar12 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int handlesbginterface(RS232PORT* pSBGInterfacePseudoRS232Port)
{
	uInt_SBG serial, hwRev, fwRev, calRev;
	uShort_SBG calYear;
	unsigned char calMonth = 0, calDay = 0;
	uShort_SBG transferCmd;
	uInt_SBG transferSize, transferOffset;
	unsigned char cmdId = 0, classId = 0;
	uShort_SBG errorCode;
	uInt_SBG time_stamp, solution_status;
	uShort_SBG imu_status;
	uFloat_SBG roll, pitch, yaw;
	uFloat_SBG q0, q1, q2, q3;
	double qw = 0, qx = 0, qy = 0, qz = 0;
	uFloat_SBG roll_acc, pitch_acc, yaw_acc;
	uFloat_SBG accx, accy, accz, gyrx, gyry, gyrz, temp, delta_vel_x, delta_vel_y, delta_vel_z, delta_angle_x, delta_angle_y, delta_angle_z;
	int sendbuflen = 0;
	uint8 sendbuf[MAX_NB_BYTES_SBG];
	unsigned char payload[256];
	int len = 0;
	int offset = 0;

	EnterCriticalSection(&StateVariablesCS);

	time_stamp.v = 0;
	roll.v = (float)fmod_2PI(Center(phihat));
	pitch.v = (float)fmod_2PI(-Center(thetahat));
	yaw.v = (float)fmod_2PI(-angle_env-Center(psihat)+M_PI/2.0);
	euler2quaternion((double)roll.v, (double)pitch.v, (double)yaw.v, &qw, &qx, &qy, &qz);
	q0.v = (float)qw; q1.v = (float)qx; q2.v = (float)qy; q3.v = (float)qz;
	roll_acc.v = 0;
	pitch_acc.v = 0;
	yaw_acc.v = 0;
	solution_status.v = SBG_ECOM_SOL_MODE_AHRS;

	imu_status.v = (unsigned short)0xFFFF;
	accx.v = (float)Center(accrxhat);
	accy.v = (float)-Center(accryhat);
	accz.v = (float)-Center(accrzhat);
	gyrx.v = (float)Center(omegaxhat);
	gyry.v = (float)-Center(omegayhat);
	gyrz.v = (float)-Center(omegazhat);
	temp.v = 0;
	delta_vel_x.v = 0;
	delta_vel_y.v = 0;
	delta_vel_z.v = 0;
	delta_angle_x.v = 0;
	delta_angle_y.v = 0;
	delta_angle_z.v = 0;

	LeaveCriticalSection(&StateVariablesCS);

	serial.v = 45000000;
	calYear.v = 2019; calMonth = 4, calDay = 22;
	calRev.c[3] = 1; calRev.c[2] = 1;
	hwRev.c[3] = 1; hwRev.c[2] = 1;
	fwRev.c[3] = 1; fwRev.c[2] = 6;

	memset(payload, 0, sizeof(payload));
	strcpy((char*)payload, "ELLIPSE2-A-G4A3-B1");
	offset = 32;
	memcpy(payload+offset, serial.c, 4);
	offset += 4;
	memcpy(payload+offset, calRev.c, 4);
	offset += 4;
	memcpy(payload+offset, calYear.c, 2);
	offset += 2;
	memcpy(payload+offset, &calMonth, 1);
	offset += 1;
	memcpy(payload+offset, &calDay, 1);
	offset += 1;
	memcpy(payload+offset, hwRev.c, 4);
	offset += 4;
	memcpy(payload+offset, fwRev.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 58;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_INFO, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	transferCmd.v = 0x0000;
	transferSize.v = 0;

	offset = 0;
	memcpy(payload+offset, transferCmd.c, 2);
	offset += 2;
	memcpy(payload+offset, transferSize.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_EXPORT_SETTINGS, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	transferCmd.v = 0x0001;
	transferOffset.v = 0;

	offset = 0;
	memcpy(payload+offset, transferCmd.c, 2);
	offset += 2;
	memcpy(payload+offset, transferOffset.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_EXPORT_SETTINGS, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	transferCmd.v = 0x0002;

	offset = 0;
	memcpy(payload+offset, transferCmd.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_EXPORT_SETTINGS, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	offset = 0;
	memcpy(payload+offset, time_stamp.c, 4);
	offset += 4;
	memcpy(payload+offset, roll.c, 4);
	offset += 4;
	memcpy(payload+offset, pitch.c, 4);
	offset += 4;
	memcpy(payload+offset, yaw.c, 4);
	offset += 4;
	memcpy(payload+offset, roll_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, pitch_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, yaw_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, solution_status.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 32;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_LOG_EKF_EULER, SBG_ECOM_CLASS_LOG_ECOM_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	offset = 0;
	memcpy(payload+offset, time_stamp.c, 4);
	offset += 4;
	memcpy(payload+offset, q0.c, 4);
	offset += 4;
	memcpy(payload+offset, q1.c, 4);
	offset += 4;
	memcpy(payload+offset, q2.c, 4);
	offset += 4;
	memcpy(payload+offset, q3.c, 4);
	offset += 4;
	memcpy(payload+offset, roll_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, pitch_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, yaw_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, solution_status.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 36;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_LOG_EKF_QUAT, SBG_ECOM_CLASS_LOG_ECOM_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	offset = 0;
	memcpy(payload+offset, time_stamp.c, 4);
	offset += 4;
	memcpy(payload+offset, imu_status.c, 2);
	offset += 2;
	memcpy(payload+offset, accx.c, 4);
	offset += 4;
	memcpy(payload+offset, accy.c, 4);
	offset += 4;
	memcpy(payload+offset, accz.c, 4);
	offset += 4;
	memcpy(payload+offset, gyrx.c, 4);
	offset += 4;
	memcpy(payload+offset, gyry.c, 4);
	offset += 4;
	memcpy(payload+offset, gyrz.c, 4);
	offset += 4;
	memcpy(payload+offset, temp.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_vel_x.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_vel_y.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_vel_z.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_angle_x.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_angle_y.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_angle_z.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 58;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_LOG_IMU_DATA, SBG_ECOM_CLASS_LOG_ECOM_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	uSleep(1000*20);

	return EXIT_SUCCESS;
}